

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::NamedValueType::SerializeWithCachedSizes
          (NamedValueType *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  psVar1 = (this->name_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.MILSpec.NamedValueType.name");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output)
    ;
  }
  if (this->type_ != (ValueType *)0x0 &&
      this != (NamedValueType *)&_NamedValueType_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->type_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void NamedValueType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.NamedValueType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (this->name().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.NamedValueType.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // .CoreML.Specification.MILSpec.ValueType type = 2;
  if (this->has_type()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->type_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.NamedValueType)
}